

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::originalParam
          (TGlslangToSpvTraverser *this,TStorageQualifier qualifier,TType *paramType,
          bool implicitThisParam)

{
  int iVar1;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  bool bVar2;
  
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000009,implicitThisParam) == 0) {
    if (this->glslangIntermediate->source == EShSourceHlsl) {
      iVar1 = (*paramType->_vptr_TType[7])(paramType);
      bVar2 = iVar1 == 0x10;
    }
    else {
      iVar1 = (*paramType->_vptr_TType[0x36])(paramType);
      if ((((char)iVar1 == '\0') ||
          ((this->glslangIntermediate->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header.
           _M_node_count != 0 ||
           (this->glslangIntermediate->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header
           ._M_node_count != 0)) &&
         (iVar1 = (*paramType->_vptr_TType[0xb])(paramType),
         (*(byte *)(CONCAT44(extraout_var,iVar1) + 0xf) & 8) == 0)) {
        iVar1 = (*paramType->_vptr_TType[7])(paramType);
        bVar2 = qualifier == EvqBuffer && iVar1 == 0x10;
      }
    }
  }
  return bVar2;
}

Assistant:

bool TGlslangToSpvTraverser::originalParam(glslang::TStorageQualifier qualifier, const glslang::TType& paramType,
                                           bool implicitThisParam)
{
    if (implicitThisParam)                                                                     // implicit this
        return true;
    if (glslangIntermediate->getSource() == glslang::EShSourceHlsl)
        return paramType.getBasicType() == glslang::EbtBlock;
    return (paramType.containsOpaque() && !glslangIntermediate->getBindlessMode()) ||       // sampler, etc.
           paramType.getQualifier().isSpirvByReference() ||                                    // spirv_by_reference
           (paramType.getBasicType() == glslang::EbtBlock && qualifier == glslang::EvqBuffer); // SSBO
}